

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::detail::Dynamic_Caster<std::runtime_error,_chaiscript::exception::eval_error>::cast
          (Dynamic_Caster<std::runtime_error,_chaiscript::exception::eval_error> *this,
          Boxed_Value *t_from)

{
  uint uVar1;
  element_type *peVar2;
  bool bVar3;
  Result_Type prVar4;
  long lVar5;
  Result_Type prVar6;
  bad_boxed_dynamic_cast *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar8;
  Boxed_Value BVar9;
  undefined1 in_stack_ffffffffffffffbf;
  Boxed_Value *local_40;
  _Alloc_hider local_38;
  reference_wrapper<chaiscript::exception::eval_error> obj;
  
  local_38._M_p = &std::runtime_error::typeinfo;
  obj._M_data = (eval_error *)&std::runtime_error::typeinfo;
  bVar3 = Type_Info::bare_equal
                    (&((t_from->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,(Type_Info *)&local_38);
  if (!bVar3) {
    this_00 = (bad_boxed_dynamic_cast *)__cxa_allocate_exception(0x48);
    peVar2 = (t_from->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string
              ((string *)&local_38,"Unknown dynamic_cast_conversion",(allocator *)&local_40);
    chaiscript::exception::bad_boxed_dynamic_cast::bad_boxed_dynamic_cast
              (this_00,&peVar2->m_type_info,
               (type_info *)&chaiscript::exception::eval_error::typeinfo,(string *)&local_38);
    __cxa_throw(this_00,&chaiscript::exception::bad_boxed_dynamic_cast::typeinfo,
                chaiscript::exception::bad_boxed_cast::~bad_boxed_cast);
  }
  peVar2 = (t_from->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = (peVar2->m_type_info).m_flags;
  if (peVar2->m_is_ref == false) {
    local_40 = t_from;
    if ((uVar1 & 1) == 0) {
      cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)&local_38);
      Boxed_Value::Object_Data::get<chaiscript::exception::eval_error>
                ((Object_Data *)this,(shared_ptr<chaiscript::exception::eval_error> *)&local_38,
                 false);
    }
    else {
      cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)&local_38);
      Boxed_Value::Object_Data::get<chaiscript::exception::eval_error_const>
                ((Object_Data *)this,
                 (shared_ptr<const_chaiscript::exception::eval_error> *)&local_38,false);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
    _Var7._M_pi = extraout_RDX;
  }
  else if ((uVar1 & 1) == 0) {
    prVar4 = Cast_Helper_Inner<std::runtime_error_&>::cast(t_from,(Type_Conversions_State *)0x0);
    lVar5 = __dynamic_cast(prVar4,&std::runtime_error::typeinfo,
                           &chaiscript::exception::eval_error::typeinfo,0);
    if (lVar5 == 0) {
LAB_0020aa41:
      __cxa_bad_cast();
    }
    sVar8 = Boxed_Value::Object_Data::get<chaiscript::exception::eval_error>
                      (obj,(bool)in_stack_ffffffffffffffbf);
    _Var7 = sVar8.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    prVar6 = Cast_Helper_Inner<const_std::runtime_error_&>::cast
                       (t_from,(Type_Conversions_State *)0x0);
    lVar5 = __dynamic_cast(prVar6,&std::runtime_error::typeinfo,
                           &chaiscript::exception::eval_error::typeinfo,0);
    if (lVar5 == 0) goto LAB_0020aa41;
    sVar8 = Boxed_Value::Object_Data::get<chaiscript::exception::eval_error_const>
                      ((reference_wrapper<const_chaiscript::exception::eval_error>)obj._M_data,
                       (bool)in_stack_ffffffffffffffbf);
    _Var7 = sVar8.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value cast(const Boxed_Value &t_from)
          {
            if (t_from.get_type_info().bare_equal(chaiscript::user_type<From>()))
            {
              if (t_from.is_pointer())
              {
                // Dynamic cast out the contained boxed value, which we know is the type we want
                if (t_from.is_const())
                {
                  return Boxed_Value(
                      [&]()->std::shared_ptr<const To>{
                        if (auto data = std::dynamic_pointer_cast<const To>(detail::Cast_Helper<std::shared_ptr<const From> >::cast(t_from, nullptr)))
                        {
                          return data;
                        } else {
                          throw std::bad_cast();
                        }
                      }()
                      );
                } else {
                  return Boxed_Value(
                      [&]()->std::shared_ptr<To>{
                        if (auto data = std::dynamic_pointer_cast<To>(detail::Cast_Helper<std::shared_ptr<From> >::cast(t_from, nullptr)))
                        {
                          return data;
                        } else {
#ifdef CHAISCRIPT_LIBCPP
                          /// \todo fix this someday after libc++ is fixed.
                          if (std::string(typeid(To).name()).find("Assignable_Proxy_Function") != std::string::npos) {
                            auto from = detail::Cast_Helper<std::shared_ptr<From> >::cast(t_from, nullptr);
                            if (std::string(typeid(*from).name()).find("Assignable_Proxy_Function_Impl") != std::string::npos) {
                              return std::static_pointer_cast<To>(from);
                            }
                          }
#endif
                          throw std::bad_cast();
                        }
                      }()
                      );
                }
              } else {
                // Pull the reference out of the contained boxed value, which we know is the type we want
                if (t_from.is_const())
                {
                  const From &d = detail::Cast_Helper<const From &>::cast(t_from, nullptr);
                  const To &data = dynamic_cast<const To &>(d);
                  return Boxed_Value(std::cref(data));
                } else {
                  From &d = detail::Cast_Helper<From &>::cast(t_from, nullptr);
                  To &data = dynamic_cast<To &>(d);
                  return Boxed_Value(std::ref(data));
                }
              }
            } else {
              throw chaiscript::exception::bad_boxed_dynamic_cast(t_from.get_type_info(), typeid(To), "Unknown dynamic_cast_conversion");
            }
          }